

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O0

pnode_t * append_transcript_word
                    (s3wid_t w,pnode_t *prev_end,s3wid_t nextw,int32 prefix_filler,
                    int32 append_filler)

{
  pnode_t *ppVar1;
  int local_44c;
  s3cipid_t local_448 [2];
  s3wid_t fw;
  s3cipid_t succ_ci [256];
  s3cipid_t pred_ci [256];
  pnode_t *local_40;
  pnode_t *node;
  pnode_t *tmp_end;
  pnode_t *new_end;
  int32 i;
  int32 append_filler_local;
  int32 prefix_filler_local;
  s3wid_t nextw_local;
  pnode_t *prev_end_local;
  s3wid_t w_local;
  
  if (0xff < mdef->n_ciphone) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/s3_align.c"
            ,0x1d5,"Increase pred_ci, succ_ci array sizes to > #CIphones (%d)\n",
            (ulong)(uint)mdef->n_ciphone);
    exit(1);
  }
  if (prev_end == (pnode_t *)0x0) {
    __assert_fail("prev_end != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/s3_align.c"
                  ,0x1d6,
                  "pnode_t *append_transcript_word(s3wid_t, pnode_t *, s3wid_t, int32, int32)");
  }
  if (prefix_filler != 0) {
    build_pred_ci(prev_end,succ_ci + 0xfc);
    build_succ_ci(w,0,local_448);
    tmp_end = (pnode_t *)0x0;
    for (new_end._0_4_ = 0; local_40 = prev_end, -1 < fillwid[(int)new_end];
        new_end._0_4_ = (int)new_end + 1) {
      for (local_44c = fillwid[(int)new_end]; -1 < local_44c; local_44c = dict->word[local_44c].alt)
      {
        ppVar1 = append_word(local_44c,prev_end,succ_ci + 0xfc,local_448);
        for (local_40 = ppVar1; local_40->next != (pnode_s *)0x0; local_40 = local_40->next) {
        }
        local_40->next = tmp_end;
        tmp_end = ppVar1;
      }
    }
    for (; local_40->next != (pnode_s *)0x0; local_40 = local_40->next) {
    }
    local_40->next = tmp_end;
  }
  build_pred_ci(prev_end,succ_ci + 0xfc);
  build_succ_ci(nextw,append_filler,local_448);
  tmp_end = (pnode_t *)0x0;
  for (prev_end_local._4_4_ = w; -1 < prev_end_local._4_4_;
      prev_end_local._4_4_ = dict->word[prev_end_local._4_4_].alt) {
    ppVar1 = append_word(prev_end_local._4_4_,prev_end,succ_ci + 0xfc,local_448);
    for (local_40 = ppVar1; local_40->next != (pnode_s *)0x0; local_40 = local_40->next) {
    }
    local_40->next = tmp_end;
    tmp_end = ppVar1;
  }
  return tmp_end;
}

Assistant:

static pnode_t *
append_transcript_word(s3wid_t w,
                                /** Transcript word to be appended */
                       pnode_t * prev_end,
                                /** Previous end points to be attached to w */
                       s3wid_t nextw,
                                /** Next word to follow w (ignoring optional fillers) */
                       int32 prefix_filler,
                                /** Whether optional filler words to precede w */
                       int32 append_filler)
{
/** Whether optional filler words to follow w */
    int32 i;
    pnode_t *new_end, *tmp_end, *node;
    s3cipid_t pred_ci[256], succ_ci[256];
    s3wid_t fw;

    if (mdef->n_ciphone >= 256)
        E_FATAL
            ("Increase pred_ci, succ_ci array sizes to > #CIphones (%d)\n",
             mdef->n_ciphone);
    assert(prev_end != NULL);

    /* Add optional silence/filler words before w, if indicated */
    if (prefix_filler) {
        build_pred_ci(prev_end, pred_ci);       /* Predecessor CI list for fillers */
        build_succ_ci(w, 0, succ_ci);   /* Successor CI list for fillers */

        new_end = NULL;
        for (i = 0; IS_S3WID(fillwid[i]); i++) {
            for (fw = fillwid[i]; IS_S3WID(fw); fw = dict->word[fw].alt) {
                tmp_end = append_word(fw, prev_end, pred_ci, succ_ci);

                for (node = tmp_end; node->next; node = node->next);
                node->next = new_end;
                new_end = tmp_end;
            }
        }

        /* Augment prev_end with new_end for filler words added above */
        for (node = prev_end; node->next; node = node->next);
        node->next = new_end;
    }

    /* Add w */
    build_pred_ci(prev_end, pred_ci);   /* Predecessor CI list for w */
    build_succ_ci(nextw, append_filler, succ_ci);       /* Successor CI list for w */

    new_end = NULL;
    for (; IS_S3WID(w); w = dict->word[w].alt) {
        tmp_end = append_word(w, prev_end, pred_ci, succ_ci);

        for (node = tmp_end; node->next; node = node->next);
        node->next = new_end;
        new_end = tmp_end;
    }

    return (new_end);
}